

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O0

void __thiscall
Scope::ForceAllSymbolNonLocalReference(Scope *this,ByteCodeGenerator *byteCodeGenerator)

{
  anon_class_16_2_c4421eab fn;
  ByteCodeGenerator *byteCodeGenerator_local;
  Scope *this_local;
  
  fn.byteCodeGenerator = byteCodeGenerator;
  fn.this = this;
  ForEachSymbol<Scope::ForceAllSymbolNonLocalReference(ByteCodeGenerator*)::__0>(this,fn);
  return;
}

Assistant:

void Scope::ForceAllSymbolNonLocalReference(ByteCodeGenerator *byteCodeGenerator)
{
    this->ForEachSymbol([this, byteCodeGenerator](Symbol *const sym)
    {
        if (!sym->IsArguments() && !sym->IsSpecialSymbol())
        {
            sym->SetHasNonLocalReference();
            byteCodeGenerator->ProcessCapturedSym(sym);
            this->GetFunc()->SetHasLocalInClosure(true);
        }
    });
}